

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_wrp.c
# Opt level: O0

int aes_wrap_init(void *vctx,uchar *key,size_t keylen,uchar *iv,size_t ivlen,OSSL_PARAM *params,
                 int enc)

{
  byte bVar1;
  int iVar2;
  long in_RCX;
  code *pcVar3;
  size_t in_RDX;
  uchar *in_RSI;
  PROV_CIPHER_CTX *in_RDI;
  void *in_R9;
  int in_stack_00000008;
  int use_forward_transform;
  PROV_AES_WRAP_CTX *wctx;
  PROV_CIPHER_CTX *ctx;
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  PROV_CIPHER_CTX *params_00;
  int local_4;
  
  params_00 = in_RDI;
  iVar2 = ossl_prov_is_running();
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    params_00->field_0x3c = params_00->field_0x3c & 0xfd | ((byte)in_stack_00000008 & 1) << 1;
    if ((params_00->field_0x3c & 1) == 0) {
      pcVar3 = CRYPTO_128_unwrap;
      if (in_stack_00000008 != 0) {
        pcVar3 = CRYPTO_128_wrap;
      }
      *(code **)&in_RDI[2].cts_mode = pcVar3;
    }
    else {
      pcVar3 = CRYPTO_128_unwrap_pad;
      if (in_stack_00000008 != 0) {
        pcVar3 = CRYPTO_128_wrap_pad;
      }
      *(code **)&in_RDI[2].cts_mode = pcVar3;
    }
    if ((in_RCX == 0) ||
       (iVar2 = ossl_cipher_generic_initiv
                          (in_RDI,(uchar *)CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8), iVar2 != 0)) {
      if (in_RSI != (uchar *)0x0) {
        if (in_RDX != params_00->keylen) {
          ERR_new();
          ERR_set_debug((char *)params_00,(int)((ulong)in_RDI >> 0x20),
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          ERR_set_error(0x39,0x69,(char *)0x0);
          return 0;
        }
        if (((byte)params_00->field_0x3c >> 5 & 1) == 0) {
          bVar1 = (byte)params_00->field_0x3c >> 1;
        }
        else {
          bVar1 = ((byte)params_00->field_0x3c >> 1 & 1) != 0 ^ 0xff;
        }
        if ((bVar1 & 1) == 0) {
          AES_set_decrypt_key(in_RSI,(int)(in_RDX << 3),(AES_KEY *)(in_RDI + 1));
          params_00->block = AES_decrypt;
        }
        else {
          AES_set_encrypt_key(in_RSI,(int)(in_RDX << 3),(AES_KEY *)(in_RDI + 1));
          params_00->block = AES_encrypt;
        }
      }
      local_4 = aes_wrap_set_ctx_params(in_R9,(OSSL_PARAM *)params_00);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int aes_wrap_init(void *vctx, const unsigned char *key,
                         size_t keylen, const unsigned char *iv,
                         size_t ivlen, const OSSL_PARAM params[], int enc)
{
    PROV_CIPHER_CTX *ctx = (PROV_CIPHER_CTX *)vctx;
    PROV_AES_WRAP_CTX *wctx = (PROV_AES_WRAP_CTX *)vctx;

    if (!ossl_prov_is_running())
        return 0;

    ctx->enc = enc;
    if (ctx->pad)
        wctx->wrapfn = enc ? CRYPTO_128_wrap_pad : CRYPTO_128_unwrap_pad;
    else
        wctx->wrapfn = enc ? CRYPTO_128_wrap : CRYPTO_128_unwrap;

    if (iv != NULL) {
        if (!ossl_cipher_generic_initiv(ctx, iv, ivlen))
            return 0;
    }
    if (key != NULL) {
        int use_forward_transform;

        if (keylen != ctx->keylen) {
           ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_KEY_LENGTH);
           return 0;
        }
        /*
         * See SP800-38F : Section 5.1
         * The forward and inverse transformations for the AES block
         * cipher—called “cipher” and “inverse  cipher” are informally known as
         * the AES encryption and AES decryption functions, respectively.
         * If the designated cipher function for a key-wrap algorithm is chosen
         * to be the AES decryption function, then CIPH-1K will be the AES
         * encryption function.
         */
        if (ctx->inverse_cipher == 0)
            use_forward_transform = ctx->enc;
        else
            use_forward_transform = !ctx->enc;
        if (use_forward_transform) {
            AES_set_encrypt_key(key, keylen * 8, &wctx->ks.ks);
            ctx->block = (block128_f)AES_encrypt;
        } else {
            AES_set_decrypt_key(key, keylen * 8, &wctx->ks.ks);
            ctx->block = (block128_f)AES_decrypt;
        }
    }
    return aes_wrap_set_ctx_params(ctx, params);
}